

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void ImGui::SetCursorPosX(float x)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  uint uVar3;
  float fVar4;
  
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->Accessed = true;
  fVar1 = (pIVar2->DC).CursorMaxPos.x;
  fVar4 = ((pIVar2->Pos).x - (pIVar2->Scroll).x) + x;
  (pIVar2->DC).CursorPos.x = fVar4;
  uVar3 = -(uint)(fVar4 <= fVar1);
  (pIVar2->DC).CursorMaxPos.x = (float)(uVar3 & (uint)fVar1 | ~uVar3 & (uint)fVar4);
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->Accessed = true; return g.CurrentWindow; }